

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

double __thiscall Table::get_max(Table *this,int col)

{
  bool bVar1;
  reference __t;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_types,_int>_> *p_Var2;
  reference pvVar3;
  reference __b;
  double *pdVar4;
  double *i;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  double ans;
  Table *pTStack_10;
  int col_local;
  Table *this_local;
  
  __range1 = (vector<double,_std::allocator<double>_> *)0x0;
  ans._4_4_ = col;
  pTStack_10 = this;
  __t = std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
        ::operator[](&this->columns,(long)col);
  p_Var2 = std::get<2ul,std::__cxx11::string,Table::types,int>(__t);
  pvVar3 = std::
           vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::operator[](&this->float_cols,(long)*p_Var2);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(&pvVar3->second);
  i = (double *)std::vector<double,_std::allocator<double>_>::end(&pvVar3->second);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&i);
    if (!bVar1) break;
    __b = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator*(&__end1);
    pdVar4 = std::max<double>((double *)&__range1,__b);
    __range1 = (vector<double,_std::allocator<double>_> *)*pdVar4;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return (double)__range1;
}

Assistant:

double Table::get_max(int col){
    double ans = 0;
    for (double& i:float_cols[std::get<2>(columns[col])].second)
        ans = std::max(ans, i);
    return ans;
}